

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

shared_ptr<cxxopts::Value> cxxopts::value<unsigned_long>(unsigned_long *t)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<cxxopts::Value> sVar1;
  element_type *this;
  
  this = in_RDI;
  std::make_shared<cxxopts::values::standard_value<unsigned_long>,unsigned_long*>
            ((unsigned_long **)in_RDI);
  std::shared_ptr<cxxopts::Value>::shared_ptr<cxxopts::values::standard_value<unsigned_long>,void>
            ((shared_ptr<cxxopts::Value> *)this,
             (shared_ptr<cxxopts::values::standard_value<unsigned_long>_> *)in_RDI);
  std::shared_ptr<cxxopts::values::standard_value<unsigned_long>_>::~shared_ptr
            ((shared_ptr<cxxopts::values::standard_value<unsigned_long>_> *)0x13037b);
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<cxxopts::Value>)
         sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
    value(T& t)
    {
        return std::make_shared<values::standard_value<T>>(&t);
    }